

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_error.hpp
# Opt level: O2

bool boost::xpressive::detail::ensure_
               (bool cond,error_type code,char *msg,char *fun,char *file,unsigned_long line)

{
  undefined7 in_register_00000039;
  regex_error local_60;
  
  if ((int)CONCAT71(in_register_00000039,cond) != 0) {
    return true;
  }
  regex_error::regex_error(&local_60,code,msg);
  local_60.super_exception.throw_line_ = (int)line;
  local_60.super_exception.throw_function_ = fun;
  local_60.super_exception.throw_file_ = file;
  throw_exception<boost::xpressive::regex_error>(&local_60);
}

Assistant:

inline bool ensure_(
        bool cond
      , regex_constants::error_type code
      , char const *msg
      , char const *fun
      , char const *file
      , unsigned long line
    )
    {
        if(!cond)
        {
            #ifndef BOOST_EXCEPTION_DISABLE
            boost::throw_exception(
                boost::xpressive::regex_error(code, msg)
                    << boost::throw_function(fun)
                    << boost::throw_file(file)
                    << boost::throw_line((int)line)
            );
            #else
            boost::throw_exception(boost::xpressive::regex_error(code, msg));
            #endif
        }
        return true;
    }